

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O3

int omp_target_is_present(void *ptr,int device_num)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  bool IsLast;
  bool local_21;
  
  uVar1 = 0;
  if ((ptr != (void *)0x0) && (uVar1 = 1, device_num != -10)) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&RTLsMtx);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    uVar5 = ((long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3) * -0x5075075075075075;
    pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
    uVar4 = (ulong)device_num;
    uVar1 = 0;
    if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
      pvVar3 = DeviceTy::getTgtPtrBegin
                         (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar4,ptr,0,&local_21,false);
      uVar1 = (uint)(pvVar3 != (void *)0x0);
    }
  }
  return uVar1;
}

Assistant:

EXTERN int omp_target_is_present(void *ptr, int device_num) {
  DP("Call to omp_target_is_present for device %d and address " DPxMOD "\n",
      device_num, DPxPTR(ptr));

  if (!ptr) {
    DP("Call to omp_target_is_present with NULL ptr, returning false\n");
    return false;
  }

  if (device_num == omp_get_initial_device()) {
    DP("Call to omp_target_is_present on host, returning true\n");
    return true;
  }

  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();
  if (Devices_size <= (size_t)device_num) {
    DP("Call to omp_target_is_present with invalid device ID, returning "
        "false\n");
    return false;
  }

  DeviceTy& Device = Devices[device_num];
  bool IsLast; // not used
  int rc = (Device.getTgtPtrBegin(ptr, 0, IsLast, false) != NULL);
  DP("Call to omp_target_is_present returns %d\n", rc);
  return rc;
}